

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O2

void icu_63::Transliterator::registerInstance(Transliterator *adoptedPrototype)

{
  UBool UVar1;
  UErrorCode ec;
  Mutex lock;
  UErrorCode local_14;
  Mutex local_10;
  
  local_10.fMutex = &registryMutex;
  umtx_lock_63(&registryMutex);
  local_14 = U_ZERO_ERROR;
  if (registry == (TransliteratorRegistry *)0x0) {
    UVar1 = initializeRegistry(&local_14);
    if (UVar1 == '\0') goto LAB_00272312;
  }
  _registerInstance(adoptedPrototype);
LAB_00272312:
  Mutex::~Mutex(&local_10);
  return;
}

Assistant:

void U_EXPORT2 Transliterator::registerInstance(Transliterator* adoptedPrototype) {
    Mutex lock(&registryMutex);
    UErrorCode ec = U_ZERO_ERROR;
    if (HAVE_REGISTRY(ec)) {
        _registerInstance(adoptedPrototype);
    }
}